

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL_AudioStatus SDL_GetAudioStatus(void)

{
  int iVar1;
  SDL_AudioStatus local_c;
  SDL_AudioStatus retval;
  
  local_c = SDL_AUDIO_STOPPED;
  (*SDL20_LockAudio)();
  if ((audio_cbdata != (AudioCallbackWrapperData *)0x0) &&
     (audio_cbdata->app_callback_opened != SDL_FALSE)) {
    iVar1 = (*SDL20_AtomicGet)(&audio_callback_paused);
    local_c = SDL_AUDIO_PLAYING;
    if (iVar1 != 0) {
      local_c = SDL_AUDIO_PAUSED;
    }
  }
  (*SDL20_UnlockAudio)();
  return local_c;
}

Assistant:

SDLCALL
SDL_GetAudioStatus(void)
{
    SDL_AudioStatus retval = SDL_AUDIO_STOPPED;
    SDL20_LockAudio();
    if (audio_cbdata && audio_cbdata->app_callback_opened) {
        retval = SDL20_AtomicGet(&audio_callback_paused) ? SDL_AUDIO_PAUSED : SDL_AUDIO_PLAYING;
    }
    SDL20_UnlockAudio();
    return retval;
}